

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O1

void __thiscall SDT::StmtsP5::dfs(StmtsP5 *this,TreeNode *treeNode,SDTNode *fa)

{
  pointer *pppSVar1;
  iterator __position;
  SDTNode *pSVar2;
  long *plVar3;
  SDTNode *pSStack_30;
  long lStack_8;
  
  plVar3 = &lStack_8;
  if ((treeNode->sons).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start ==
      (treeNode->sons).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    return;
  }
  if (treeNode->opt == 1) {
    dfs();
  }
  else if (treeNode->opt != 0) {
    return;
  }
  dfs();
  pSStack_30 = (SDTNode *)*plVar3;
  if (pSStack_30 != (SDTNode *)plVar3[1]) {
    pSVar2 = (SDTNode *)operator_new(0x68);
    (pSVar2->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar2->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar2->sons).super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pSVar2->_vptr_SDTNode = (_func_int **)&PTR_dfs_00126ca8;
    *(undefined4 *)&pSVar2[1]._vptr_SDTNode = 0;
    pSVar2[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&pSVar2[1].sons.
                   super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    pSVar2[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 *)
     &pSVar2[1].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0;
    pSVar2[2].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&pSVar2[2].sons.
                   super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    pSVar2[2].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 *)
     &pSVar2[2].sons.super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0;
    __position._M_current =
         (this->super_SDTNode).sons.
         super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pSStack_30 = pSVar2;
    if (__position._M_current ==
        (this->super_SDTNode).sons.
        super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>>::_M_realloc_insert<SDT::SDTNode*>
                ((vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>> *)&(this->super_SDTNode).sons,
                 __position,&pSStack_30);
    }
    else {
      *__position._M_current = pSVar2;
      pppSVar1 = &(this->super_SDTNode).sons.
                  super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    std::__cxx11::string::_M_assign((string *)&pSVar2[2].sons);
    (**pSVar2->_vptr_SDTNode)
              (pSVar2,resultTree.super__Vector_base<TreeNode,_std::allocator<TreeNode>_>._M_impl.
                      super__Vector_impl_data._M_start + *(int *)*plVar3,this);
    this->gotoNext = *(int *)&pSVar2[1]._vptr_SDTNode;
  }
  return;
}

Assistant:

void StmtsP5::dfs(TreeNode &treeNode, SDT::SDTNode *fa){
        if (treeNode.sons.empty()) return;
        if(treeNode.opt==0){
            StmtsP *stmtsP = new StmtsP;
            sons.push_back(stmtsP);
            writeLabel(gotoBegin);
            stmtsP->gotoNext = gotoNext;
            stmtsP->dfs(SON(0));
        }else if(treeNode.opt==1){
            Noelse *noelse_1 = new Noelse;
            StmtsP *stmtsP_1 = new StmtsP;
            sons.push_back(noelse_1);
            sons.push_back(stmtsP_1);
            noelse_1->gotoNext = gotoNext;
            noelse_1->dfs(SON(1));
            writeLabel(gotoBegin);
            stmtsP_1->gotoNext = gotoNext;
            stmtsP_1->dfs(SON(2));

        }
    }